

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_HKDF.c
# Opt level: O3

void expand_blake2b(uint8_t *okm,uint8_t *prk,uint32_t prklen,uint8_t *info,uint32_t infolen,
                   uint32_t len)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint uVar11;
  ulong uVar12;
  uint32_t uVar13;
  undefined4 in_register_0000008c;
  uint8_t uVar14;
  uint32_t uVar15;
  ulong uVar16;
  uint uVar17;
  ulong __n;
  uint8_t *dst;
  undefined8 uStack_80;
  uint8_t auStack_78 [8];
  ulong local_70 [3];
  uint32_t local_58;
  uint local_54;
  uint8_t *local_50 [2];
  uint8_t *local_40;
  uint8_t auStack_38 [4];
  uint32_t local_34;
  
  local_70[2] = CONCAT44(in_register_0000008c,len);
  __n = (ulong)infolen;
  uVar12 = (ulong)(infolen + 0x41);
  uVar16 = uVar12 + 0xf & 0xfffffffffffffff0;
  lVar1 = -uVar16;
  dst = auStack_78 + lVar1;
  local_70[1] = uVar12;
  local_50[1] = prk;
  local_40 = info;
  local_34 = prklen;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x176cff;
  memset(dst,0,uVar12);
  puVar10 = local_40;
  uVar12 = local_70[2];
  local_50[0] = auStack_38 + -uVar16;
  local_40 = (uint8_t *)__n;
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x176d25;
  memcpy(auStack_38 + -uVar16,puVar10,__n);
  uVar17 = (uint)uVar12;
  if (uVar17 < 0x40) {
    if (uVar17 == 0) {
      return;
    }
    local_50[0][(long)local_40] = '\x01';
    uVar11 = 0;
  }
  else {
    local_54 = (uint)(uVar12 >> 6) & 0x3ffffff;
    local_58 = infolen + 1;
    uVar17 = local_54 << 6;
    uVar14 = '\x01';
    uVar12 = 0;
    local_70[0] = __n;
    do {
      uVar15 = local_34;
      puVar10 = local_50[1];
      local_50[0][(long)local_40] = uVar14;
      puVar9 = local_50[0];
      uVar13 = local_58;
      if (uVar12 != 0) {
        puVar9 = dst;
        uVar13 = (uint32_t)local_70[1];
      }
      *(undefined8 *)((long)&uStack_80 + lVar1) = 0x176d9c;
      EverCrypt_HMAC_compute_blake2b(dst,puVar10,uVar15,puVar9,uVar13);
      uVar2 = *(undefined8 *)dst;
      uVar3 = *(undefined8 *)((long)local_70 + lVar1);
      uVar4 = *(undefined8 *)((long)local_70 + lVar1 + 8);
      uVar5 = *(undefined8 *)((long)local_70 + lVar1 + 0x10);
      uVar6 = *(undefined8 *)((long)&local_58 + lVar1);
      uVar7 = *(undefined8 *)((long)local_50 + lVar1);
      uVar8 = *(undefined8 *)(auStack_38 + lVar1 + -8);
      *(undefined8 *)(okm + uVar12 + 0x30) = *(undefined8 *)((long)local_50 + lVar1 + 8);
      *(undefined8 *)(okm + uVar12 + 0x30 + 8) = uVar8;
      *(undefined8 *)(okm + uVar12 + 0x20) = uVar6;
      *(undefined8 *)(okm + uVar12 + 0x20 + 8) = uVar7;
      *(undefined8 *)(okm + uVar12 + 0x10) = uVar4;
      *(undefined8 *)(okm + uVar12 + 0x10 + 8) = uVar5;
      *(undefined8 *)(okm + uVar12) = uVar2;
      *(undefined8 *)(okm + uVar12 + 8) = uVar3;
      uVar12 = uVar12 + 0x40;
      uVar14 = uVar14 + '\x01';
    } while (uVar17 != uVar12);
    uVar17 = (uint)local_70[2];
    uVar11 = uVar17 & 0xffffffc0;
    infolen = (uint32_t)local_70[0];
    if (uVar11 == uVar17) {
      return;
    }
    local_50[0][(long)local_40] = (char)local_54 + '\x01';
    if (0x3f < uVar17) {
      uVar15 = (uint32_t)local_70[1];
      puVar10 = dst;
      goto LAB_00176e1e;
    }
  }
  uVar15 = infolen + 1;
  puVar10 = local_50[0];
LAB_00176e1e:
  uVar13 = local_34;
  puVar9 = local_50[1];
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x176e23;
  EverCrypt_HMAC_compute_blake2b(dst,puVar9,uVar13,puVar10,uVar15);
  *(undefined8 *)((long)&uStack_80 + lVar1) = 0x176e3a;
  memcpy(okm + uVar11,dst,(ulong)(uVar17 & 0x3f));
  return;
}

Assistant:

static void
expand_blake2b(
  uint8_t *okm,
  uint8_t *prk,
  uint32_t prklen,
  uint8_t *info,
  uint32_t infolen,
  uint32_t len
)
{
  uint32_t tlen = 64U;
  uint32_t n = len / tlen;
  uint8_t *output = okm;
  KRML_CHECK_SIZE(sizeof (uint8_t), tlen + infolen + 1U);
  uint8_t text[tlen + infolen + 1U];
  memset(text, 0U, (tlen + infolen + 1U) * sizeof (uint8_t));
  uint8_t *text0 = text + tlen;
  uint8_t *tag = text;
  uint8_t *ctr = text + tlen + infolen;
  memcpy(text + tlen, info, infolen * sizeof (uint8_t));
  for (uint32_t i = 0U; i < n; i++)
  {
    ctr[0U] = (uint8_t)(i + 1U);
    if (i == 0U)
    {
      EverCrypt_HMAC_compute_blake2b(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_blake2b(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    memcpy(output + i * tlen, tag, tlen * sizeof (uint8_t));
  }
  if (n * tlen < len)
  {
    ctr[0U] = (uint8_t)(n + 1U);
    if (n == 0U)
    {
      EverCrypt_HMAC_compute_blake2b(tag, prk, prklen, text0, infolen + 1U);
    }
    else
    {
      EverCrypt_HMAC_compute_blake2b(tag, prk, prklen, text, tlen + infolen + 1U);
    }
    uint8_t *block = okm + n * tlen;
    memcpy(block, tag, (len - n * tlen) * sizeof (uint8_t));
  }
}